

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_queue.h
# Opt level: O3

void __thiscall
buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
buffer_queue(buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,int max_size,bool debug)

{
  ulong *puVar1;
  ulong *puVar2;
  invalid_argument *this_00;
  long lVar3;
  
  *(undefined8 *)((long)&(this->b_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->b_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->b_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->b_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->b_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->b_cond);
  this->b_rcnt = 0;
  this->b_wcnt = 0;
  this->b_debug = false;
  this->b_first = -1;
  this->b_last = -1;
  this->b_size = 0;
  this->capacity = 1000;
  if (0 < max_size) {
    this->b_debug = debug;
    this->capacity = max_size;
    lVar3 = (ulong)(uint)max_size * 0x20;
    puVar1 = (ulong *)operator_new__(lVar3 + 8);
    *puVar1 = (ulong)(uint)max_size;
    puVar2 = puVar1 + 3;
    do {
      puVar2[-2] = (ulong)puVar2;
      puVar2[-1] = 0;
      *(undefined1 *)puVar2 = 0;
      puVar2 = puVar2 + 4;
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != 0);
    this->b_array =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar1 + 1);
    return;
  }
  if (-1 < pr_level) {
    printf("[%-5s][%s:%d] max_size is illegal!\n","error","buffer_queue",0x1c);
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"max_size is illegal!");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

explicit buffer_queue(int max_size, bool debug=false)
    {
        if (max_size <= 0)
        {
            PR_ERROR("max_size is illegal!\n");
           // exit(-1);
           throw invalid_argument("max_size is illegal!");
        }

        b_debug = debug;
        capacity = max_size;
        b_array = new T[capacity];
    }